

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void move_pending_to_connect(Curl_multi *multi,Curl_easy *data)

{
  curltime cVar1;
  curltime local_20;
  
  Curl_uint_bset_remove(&multi->pending,data->mid);
  Curl_uint_bset_add(&multi->process,data->mid);
  mstate(data,MSTATE_CONNECT);
  cVar1 = Curl_now();
  local_20.tv_sec = cVar1.tv_sec;
  local_20.tv_usec = cVar1.tv_usec;
  Curl_expire_ex(data,&local_20,0,EXPIRE_RUN_NOW);
  return;
}

Assistant:

static void move_pending_to_connect(struct Curl_multi *multi,
                                    struct Curl_easy *data)
{
  DEBUGASSERT(data->mstate == MSTATE_PENDING);

  /* Remove this node from the pending set, add into process set */
  Curl_uint_bset_remove(&multi->pending, data->mid);
  Curl_uint_bset_add(&multi->process, data->mid);

  multistate(data, MSTATE_CONNECT);

  /* Make sure that the handle will be processed soonish. */
  Curl_expire(data, 0, EXPIRE_RUN_NOW);
}